

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

wchar_t __thiscall CVmPackPos::getch(CVmPackPos *this)

{
  byte bVar1;
  byte *pbVar2;
  wchar_t wVar3;
  int iVar4;
  byte *pbVar5;
  
  pbVar5 = (byte *)this->len;
  while (((pbVar5 != (byte *)0x0 && (wVar3 = utf8_ptr::s_getch((this->p).p_), (uint)wVar3 < 0x80))
         && (iVar4 = isspace(wVar3), iVar4 != 0))) {
    this->idx = this->idx + 1;
    pbVar2 = (byte *)(this->p).p_;
    bVar1 = *pbVar2;
    pbVar5 = pbVar2 + (this->len -
                      (long)(pbVar2 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3)
                                      + 1));
    this->len = (size_t)pbVar5;
    (this->p).p_ = (char *)(pbVar2 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) +
                                     1);
  }
  if (this->len == 0) {
    return L'\0';
  }
  wVar3 = utf8_ptr::s_getch((this->p).p_);
  return wVar3;
}

Assistant:

wchar_t getch()
    {
        /* skip spaces */
        while (len != 0 && is_space(p.getch()))
        {
            ++idx;
            p.inc(&len);
        }

        /* return the current character */
        return getch_raw();
    }